

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O2

void __thiscall
TPZMatrixSolver<double>::TPZMatrixSolver
          (TPZMatrixSolver<double> *this,void **vtt,TPZMatrixSolver<double> *Source)

{
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&this->fReferenceMatrix);
  TPZFMatrix<double>::TPZFMatrix(&this->fScratch);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&this->fContainer);
  TPZAutoPointer<TPZMatrix<double>_>::operator=(&this->fReferenceMatrix,&Source->fReferenceMatrix);
  TPZAutoPointer<TPZMatrix<double>_>::operator=(&this->fContainer,&Source->fContainer);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(const TPZMatrixSolver<TVar> &Source) :
fScratch()
{
	fReferenceMatrix = Source.fReferenceMatrix;
	fContainer = Source.fContainer;
}